

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

void updateKeyCodeLUT(void)

{
  int iVar1;
  long lVar2;
  XkbDescPtr descr;
  undefined1 local_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char name [5];
  int keyCodeGLFW;
  int keyCode;
  int i;
  
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  for (; (int)name._1_4_ < 0x100; name._1_4_ = name._1_4_ + 1) {
    _glfw.x11.keyCodeLUT[(int)name._1_4_] = -1;
  }
  lVar2 = XkbGetKeyboard(_glfw.x11.display,0x7f,0x100);
  for (name._1_4_ = ZEXT14(*(byte *)(lVar2 + 0xc));
      (int)name._1_4_ <= (int)(uint)*(byte *)(lVar2 + 0xd); name._1_4_ = name._1_4_ + 1) {
    for (keyCodeGLFW = 0; keyCodeGLFW < 4; keyCodeGLFW = keyCodeGLFW + 1) {
      *(undefined1 *)((long)&descr + (long)keyCodeGLFW + 7) =
           *(undefined1 *)
            (*(long *)(*(long *)(lVar2 + 0x30) + 0x1c8) + (long)(int)name._1_4_ * 4 +
            (long)keyCodeGLFW);
    }
    local_15 = 0;
    iVar1 = strcmp((char *)((long)&descr + 7),"TLDE");
    if (iVar1 == 0) {
      cStack_14 = '`';
      cStack_13 = '\0';
      cStack_12 = '\0';
      name[0] = '\0';
    }
    else {
      iVar1 = strcmp((char *)((long)&descr + 7),"AE01");
      if (iVar1 == 0) {
        cStack_14 = '1';
        cStack_13 = '\0';
        cStack_12 = '\0';
        name[0] = '\0';
      }
      else {
        iVar1 = strcmp((char *)((long)&descr + 7),"AE02");
        if (iVar1 == 0) {
          cStack_14 = '2';
          cStack_13 = '\0';
          cStack_12 = '\0';
          name[0] = '\0';
        }
        else {
          iVar1 = strcmp((char *)((long)&descr + 7),"AE03");
          if (iVar1 == 0) {
            cStack_14 = '3';
            cStack_13 = '\0';
            cStack_12 = '\0';
            name[0] = '\0';
          }
          else {
            iVar1 = strcmp((char *)((long)&descr + 7),"AE04");
            if (iVar1 == 0) {
              cStack_14 = '4';
              cStack_13 = '\0';
              cStack_12 = '\0';
              name[0] = '\0';
            }
            else {
              iVar1 = strcmp((char *)((long)&descr + 7),"AE05");
              if (iVar1 == 0) {
                cStack_14 = '5';
                cStack_13 = '\0';
                cStack_12 = '\0';
                name[0] = '\0';
              }
              else {
                iVar1 = strcmp((char *)((long)&descr + 7),"AE06");
                if (iVar1 == 0) {
                  cStack_14 = '6';
                  cStack_13 = '\0';
                  cStack_12 = '\0';
                  name[0] = '\0';
                }
                else {
                  iVar1 = strcmp((char *)((long)&descr + 7),"AE07");
                  if (iVar1 == 0) {
                    cStack_14 = '7';
                    cStack_13 = '\0';
                    cStack_12 = '\0';
                    name[0] = '\0';
                  }
                  else {
                    iVar1 = strcmp((char *)((long)&descr + 7),"AE08");
                    if (iVar1 == 0) {
                      cStack_14 = '8';
                      cStack_13 = '\0';
                      cStack_12 = '\0';
                      name[0] = '\0';
                    }
                    else {
                      iVar1 = strcmp((char *)((long)&descr + 7),"AE09");
                      if (iVar1 == 0) {
                        cStack_14 = '9';
                        cStack_13 = '\0';
                        cStack_12 = '\0';
                        name[0] = '\0';
                      }
                      else {
                        iVar1 = strcmp((char *)((long)&descr + 7),"AE10");
                        if (iVar1 == 0) {
                          cStack_14 = '0';
                          cStack_13 = '\0';
                          cStack_12 = '\0';
                          name[0] = '\0';
                        }
                        else {
                          iVar1 = strcmp((char *)((long)&descr + 7),"AE11");
                          if (iVar1 == 0) {
                            cStack_14 = '-';
                            cStack_13 = '\0';
                            cStack_12 = '\0';
                            name[0] = '\0';
                          }
                          else {
                            iVar1 = strcmp((char *)((long)&descr + 7),"AE12");
                            if (iVar1 == 0) {
                              cStack_14 = '=';
                              cStack_13 = '\0';
                              cStack_12 = '\0';
                              name[0] = '\0';
                            }
                            else {
                              iVar1 = strcmp((char *)((long)&descr + 7),"AD01");
                              if (iVar1 == 0) {
                                cStack_14 = 'Q';
                                cStack_13 = '\0';
                                cStack_12 = '\0';
                                name[0] = '\0';
                              }
                              else {
                                iVar1 = strcmp((char *)((long)&descr + 7),"AD02");
                                if (iVar1 == 0) {
                                  cStack_14 = 'W';
                                  cStack_13 = '\0';
                                  cStack_12 = '\0';
                                  name[0] = '\0';
                                }
                                else {
                                  iVar1 = strcmp((char *)((long)&descr + 7),"AD03");
                                  if (iVar1 == 0) {
                                    cStack_14 = 'E';
                                    cStack_13 = '\0';
                                    cStack_12 = '\0';
                                    name[0] = '\0';
                                  }
                                  else {
                                    iVar1 = strcmp((char *)((long)&descr + 7),"AD04");
                                    if (iVar1 == 0) {
                                      cStack_14 = 'R';
                                      cStack_13 = '\0';
                                      cStack_12 = '\0';
                                      name[0] = '\0';
                                    }
                                    else {
                                      iVar1 = strcmp((char *)((long)&descr + 7),"AD05");
                                      if (iVar1 == 0) {
                                        cStack_14 = 'T';
                                        cStack_13 = '\0';
                                        cStack_12 = '\0';
                                        name[0] = '\0';
                                      }
                                      else {
                                        iVar1 = strcmp((char *)((long)&descr + 7),"AD06");
                                        if (iVar1 == 0) {
                                          cStack_14 = 'Y';
                                          cStack_13 = '\0';
                                          cStack_12 = '\0';
                                          name[0] = '\0';
                                        }
                                        else {
                                          iVar1 = strcmp((char *)((long)&descr + 7),"AD07");
                                          if (iVar1 == 0) {
                                            cStack_14 = 'U';
                                            cStack_13 = '\0';
                                            cStack_12 = '\0';
                                            name[0] = '\0';
                                          }
                                          else {
                                            iVar1 = strcmp((char *)((long)&descr + 7),"AD08");
                                            if (iVar1 == 0) {
                                              cStack_14 = 'I';
                                              cStack_13 = '\0';
                                              cStack_12 = '\0';
                                              name[0] = '\0';
                                            }
                                            else {
                                              iVar1 = strcmp((char *)((long)&descr + 7),"AD09");
                                              if (iVar1 == 0) {
                                                cStack_14 = 'O';
                                                cStack_13 = '\0';
                                                cStack_12 = '\0';
                                                name[0] = '\0';
                                              }
                                              else {
                                                iVar1 = strcmp((char *)((long)&descr + 7),"AD10");
                                                if (iVar1 == 0) {
                                                  cStack_14 = 'P';
                                                  cStack_13 = '\0';
                                                  cStack_12 = '\0';
                                                  name[0] = '\0';
                                                }
                                                else {
                                                  iVar1 = strcmp((char *)((long)&descr + 7),"AD11");
                                                  if (iVar1 == 0) {
                                                    cStack_14 = '[';
                                                    cStack_13 = '\0';
                                                    cStack_12 = '\0';
                                                    name[0] = '\0';
                                                  }
                                                  else {
                                                    iVar1 = strcmp((char *)((long)&descr + 7),"AD12"
                                                                  );
                                                    if (iVar1 == 0) {
                                                      cStack_14 = ']';
                                                      cStack_13 = '\0';
                                                      cStack_12 = '\0';
                                                      name[0] = '\0';
                                                    }
                                                    else {
                                                      iVar1 = strcmp((char *)((long)&descr + 7),
                                                                     "AC01");
                                                      if (iVar1 == 0) {
                                                        cStack_14 = 'A';
                                                        cStack_13 = '\0';
                                                        cStack_12 = '\0';
                                                        name[0] = '\0';
                                                      }
                                                      else {
                                                        iVar1 = strcmp((char *)((long)&descr + 7),
                                                                       "AC02");
                                                        if (iVar1 == 0) {
                                                          cStack_14 = 'S';
                                                          cStack_13 = '\0';
                                                          cStack_12 = '\0';
                                                          name[0] = '\0';
                                                        }
                                                        else {
                                                          iVar1 = strcmp((char *)((long)&descr + 7),
                                                                         "AC03");
                                                          if (iVar1 == 0) {
                                                            cStack_14 = 'D';
                                                            cStack_13 = '\0';
                                                            cStack_12 = '\0';
                                                            name[0] = '\0';
                                                          }
                                                          else {
                                                            iVar1 = strcmp((char *)((long)&descr + 7
                                                                                   ),"AC04");
                                                            if (iVar1 == 0) {
                                                              cStack_14 = 'F';
                                                              cStack_13 = '\0';
                                                              cStack_12 = '\0';
                                                              name[0] = '\0';
                                                            }
                                                            else {
                                                              iVar1 = strcmp((char *)((long)&descr +
                                                                                     7),"AC05");
                                                              if (iVar1 == 0) {
                                                                cStack_14 = 'G';
                                                                cStack_13 = '\0';
                                                                cStack_12 = '\0';
                                                                name[0] = '\0';
                                                              }
                                                              else {
                                                                iVar1 = strcmp((char *)((long)&descr
                                                                                       + 7),"AC06");
                                                                if (iVar1 == 0) {
                                                                  cStack_14 = 'H';
                                                                  cStack_13 = '\0';
                                                                  cStack_12 = '\0';
                                                                  name[0] = '\0';
                                                                }
                                                                else {
                                                                  iVar1 = strcmp((char *)((long)&
                                                  descr + 7),"AC07");
                                                  if (iVar1 == 0) {
                                                    cStack_14 = 'J';
                                                    cStack_13 = '\0';
                                                    cStack_12 = '\0';
                                                    name[0] = '\0';
                                                  }
                                                  else {
                                                    iVar1 = strcmp((char *)((long)&descr + 7),"AC08"
                                                                  );
                                                    if (iVar1 == 0) {
                                                      cStack_14 = 'K';
                                                      cStack_13 = '\0';
                                                      cStack_12 = '\0';
                                                      name[0] = '\0';
                                                    }
                                                    else {
                                                      iVar1 = strcmp((char *)((long)&descr + 7),
                                                                     "AC09");
                                                      if (iVar1 == 0) {
                                                        cStack_14 = 'L';
                                                        cStack_13 = '\0';
                                                        cStack_12 = '\0';
                                                        name[0] = '\0';
                                                      }
                                                      else {
                                                        iVar1 = strcmp((char *)((long)&descr + 7),
                                                                       "AC10");
                                                        if (iVar1 == 0) {
                                                          cStack_14 = ';';
                                                          cStack_13 = '\0';
                                                          cStack_12 = '\0';
                                                          name[0] = '\0';
                                                        }
                                                        else {
                                                          iVar1 = strcmp((char *)((long)&descr + 7),
                                                                         "AC11");
                                                          if (iVar1 == 0) {
                                                            cStack_14 = '\'';
                                                            cStack_13 = '\0';
                                                            cStack_12 = '\0';
                                                            name[0] = '\0';
                                                          }
                                                          else {
                                                            iVar1 = strcmp((char *)((long)&descr + 7
                                                                                   ),"AB01");
                                                            if (iVar1 == 0) {
                                                              cStack_14 = 'Z';
                                                              cStack_13 = '\0';
                                                              cStack_12 = '\0';
                                                              name[0] = '\0';
                                                            }
                                                            else {
                                                              iVar1 = strcmp((char *)((long)&descr +
                                                                                     7),"AB02");
                                                              if (iVar1 == 0) {
                                                                cStack_14 = 'X';
                                                                cStack_13 = '\0';
                                                                cStack_12 = '\0';
                                                                name[0] = '\0';
                                                              }
                                                              else {
                                                                iVar1 = strcmp((char *)((long)&descr
                                                                                       + 7),"AB03");
                                                                if (iVar1 == 0) {
                                                                  cStack_14 = 'C';
                                                                  cStack_13 = '\0';
                                                                  cStack_12 = '\0';
                                                                  name[0] = '\0';
                                                                }
                                                                else {
                                                                  iVar1 = strcmp((char *)((long)&
                                                  descr + 7),"AB04");
                                                  if (iVar1 == 0) {
                                                    cStack_14 = 'V';
                                                    cStack_13 = '\0';
                                                    cStack_12 = '\0';
                                                    name[0] = '\0';
                                                  }
                                                  else {
                                                    iVar1 = strcmp((char *)((long)&descr + 7),"AB05"
                                                                  );
                                                    if (iVar1 == 0) {
                                                      cStack_14 = 'B';
                                                      cStack_13 = '\0';
                                                      cStack_12 = '\0';
                                                      name[0] = '\0';
                                                    }
                                                    else {
                                                      iVar1 = strcmp((char *)((long)&descr + 7),
                                                                     "AB06");
                                                      if (iVar1 == 0) {
                                                        cStack_14 = 'N';
                                                        cStack_13 = '\0';
                                                        cStack_12 = '\0';
                                                        name[0] = '\0';
                                                      }
                                                      else {
                                                        iVar1 = strcmp((char *)((long)&descr + 7),
                                                                       "AB07");
                                                        if (iVar1 == 0) {
                                                          cStack_14 = 'M';
                                                          cStack_13 = '\0';
                                                          cStack_12 = '\0';
                                                          name[0] = '\0';
                                                        }
                                                        else {
                                                          iVar1 = strcmp((char *)((long)&descr + 7),
                                                                         "AB08");
                                                          if (iVar1 == 0) {
                                                            cStack_14 = ',';
                                                            cStack_13 = '\0';
                                                            cStack_12 = '\0';
                                                            name[0] = '\0';
                                                          }
                                                          else {
                                                            iVar1 = strcmp((char *)((long)&descr + 7
                                                                                   ),"AB09");
                                                            if (iVar1 == 0) {
                                                              cStack_14 = '.';
                                                              cStack_13 = '\0';
                                                              cStack_12 = '\0';
                                                              name[0] = '\0';
                                                            }
                                                            else {
                                                              iVar1 = strcmp((char *)((long)&descr +
                                                                                     7),"AB10");
                                                              if (iVar1 == 0) {
                                                                cStack_14 = '/';
                                                                cStack_13 = '\0';
                                                                cStack_12 = '\0';
                                                                name[0] = '\0';
                                                              }
                                                              else {
                                                                iVar1 = strcmp((char *)((long)&descr
                                                                                       + 7),"BKSL");
                                                                if (iVar1 == 0) {
                                                                  cStack_14 = '\\';
                                                                  cStack_13 = '\0';
                                                                  cStack_12 = '\0';
                                                                  name[0] = '\0';
                                                                }
                                                                else {
                                                                  iVar1 = strcmp((char *)((long)&
                                                  descr + 7),"LSGT");
                                                  if (iVar1 == 0) {
                                                    cStack_14 = -0x5f;
                                                    cStack_13 = '\0';
                                                    cStack_12 = '\0';
                                                    name[0] = '\0';
                                                  }
                                                  else {
                                                    cStack_14 = -1;
                                                    cStack_13 = -1;
                                                    cStack_12 = -1;
                                                    name[0] = -1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((-1 < (int)name._1_4_) && ((int)name._1_4_ < 0x100)) {
      _glfw.x11.keyCodeLUT[(int)name._1_4_] = _cStack_14;
    }
  }
  XkbFreeKeyboard(lVar2,0,1);
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  for (; (int)name._1_4_ < 0x100; name._1_4_ = name._1_4_ + 1) {
    if (_glfw.x11.keyCodeLUT[(int)name._1_4_] < 0) {
      iVar1 = translateKey(name._1_4_);
      _glfw.x11.keyCodeLUT[(int)name._1_4_] = iVar1;
    }
  }
  return;
}

Assistant:

static void updateKeyCodeLUT(void)
{
    int i, keyCode, keyCodeGLFW;
    char name[XkbKeyNameLength + 1];
    XkbDescPtr descr;

    // Clear the LUT
    for (keyCode = 0;  keyCode < 256;  keyCode++)
        _glfw.x11.keyCodeLUT[keyCode] = GLFW_KEY_UNKNOWN;

    // Use XKB to determine physical key locations independently of the current
    // keyboard layout

    // Get keyboard description
    descr = XkbGetKeyboard(_glfw.x11.display,
                            XkbAllComponentsMask,
                            XkbUseCoreKbd);

    // Find the X11 key code -> GLFW key code mapping
    for (keyCode = descr->min_key_code; keyCode <= descr->max_key_code; ++keyCode)
    {
        // Get the key name
        for (i = 0;  i < XkbKeyNameLength;  i++)
            name[i] = descr->names->keys[keyCode].name[i];

        name[XkbKeyNameLength] = 0;

        // Map the key name to a GLFW key code. Note: We only map printable
        // keys here, and we use the US keyboard layout. The rest of the
        // keys (function keys) are mapped using traditional KeySym
        // translations.
        if (strcmp(name, "TLDE") == 0) keyCodeGLFW = GLFW_KEY_GRAVE_ACCENT;
        else if (strcmp(name, "AE01") == 0) keyCodeGLFW = GLFW_KEY_1;
        else if (strcmp(name, "AE02") == 0) keyCodeGLFW = GLFW_KEY_2;
        else if (strcmp(name, "AE03") == 0) keyCodeGLFW = GLFW_KEY_3;
        else if (strcmp(name, "AE04") == 0) keyCodeGLFW = GLFW_KEY_4;
        else if (strcmp(name, "AE05") == 0) keyCodeGLFW = GLFW_KEY_5;
        else if (strcmp(name, "AE06") == 0) keyCodeGLFW = GLFW_KEY_6;
        else if (strcmp(name, "AE07") == 0) keyCodeGLFW = GLFW_KEY_7;
        else if (strcmp(name, "AE08") == 0) keyCodeGLFW = GLFW_KEY_8;
        else if (strcmp(name, "AE09") == 0) keyCodeGLFW = GLFW_KEY_9;
        else if (strcmp(name, "AE10") == 0) keyCodeGLFW = GLFW_KEY_0;
        else if (strcmp(name, "AE11") == 0) keyCodeGLFW = GLFW_KEY_MINUS;
        else if (strcmp(name, "AE12") == 0) keyCodeGLFW = GLFW_KEY_EQUAL;
        else if (strcmp(name, "AD01") == 0) keyCodeGLFW = GLFW_KEY_Q;
        else if (strcmp(name, "AD02") == 0) keyCodeGLFW = GLFW_KEY_W;
        else if (strcmp(name, "AD03") == 0) keyCodeGLFW = GLFW_KEY_E;
        else if (strcmp(name, "AD04") == 0) keyCodeGLFW = GLFW_KEY_R;
        else if (strcmp(name, "AD05") == 0) keyCodeGLFW = GLFW_KEY_T;
        else if (strcmp(name, "AD06") == 0) keyCodeGLFW = GLFW_KEY_Y;
        else if (strcmp(name, "AD07") == 0) keyCodeGLFW = GLFW_KEY_U;
        else if (strcmp(name, "AD08") == 0) keyCodeGLFW = GLFW_KEY_I;
        else if (strcmp(name, "AD09") == 0) keyCodeGLFW = GLFW_KEY_O;
        else if (strcmp(name, "AD10") == 0) keyCodeGLFW = GLFW_KEY_P;
        else if (strcmp(name, "AD11") == 0) keyCodeGLFW = GLFW_KEY_LEFT_BRACKET;
        else if (strcmp(name, "AD12") == 0) keyCodeGLFW = GLFW_KEY_RIGHT_BRACKET;
        else if (strcmp(name, "AC01") == 0) keyCodeGLFW = GLFW_KEY_A;
        else if (strcmp(name, "AC02") == 0) keyCodeGLFW = GLFW_KEY_S;
        else if (strcmp(name, "AC03") == 0) keyCodeGLFW = GLFW_KEY_D;
        else if (strcmp(name, "AC04") == 0) keyCodeGLFW = GLFW_KEY_F;
        else if (strcmp(name, "AC05") == 0) keyCodeGLFW = GLFW_KEY_G;
        else if (strcmp(name, "AC06") == 0) keyCodeGLFW = GLFW_KEY_H;
        else if (strcmp(name, "AC07") == 0) keyCodeGLFW = GLFW_KEY_J;
        else if (strcmp(name, "AC08") == 0) keyCodeGLFW = GLFW_KEY_K;
        else if (strcmp(name, "AC09") == 0) keyCodeGLFW = GLFW_KEY_L;
        else if (strcmp(name, "AC10") == 0) keyCodeGLFW = GLFW_KEY_SEMICOLON;
        else if (strcmp(name, "AC11") == 0) keyCodeGLFW = GLFW_KEY_APOSTROPHE;
        else if (strcmp(name, "AB01") == 0) keyCodeGLFW = GLFW_KEY_Z;
        else if (strcmp(name, "AB02") == 0) keyCodeGLFW = GLFW_KEY_X;
        else if (strcmp(name, "AB03") == 0) keyCodeGLFW = GLFW_KEY_C;
        else if (strcmp(name, "AB04") == 0) keyCodeGLFW = GLFW_KEY_V;
        else if (strcmp(name, "AB05") == 0) keyCodeGLFW = GLFW_KEY_B;
        else if (strcmp(name, "AB06") == 0) keyCodeGLFW = GLFW_KEY_N;
        else if (strcmp(name, "AB07") == 0) keyCodeGLFW = GLFW_KEY_M;
        else if (strcmp(name, "AB08") == 0) keyCodeGLFW = GLFW_KEY_COMMA;
        else if (strcmp(name, "AB09") == 0) keyCodeGLFW = GLFW_KEY_PERIOD;
        else if (strcmp(name, "AB10") == 0) keyCodeGLFW = GLFW_KEY_SLASH;
        else if (strcmp(name, "BKSL") == 0) keyCodeGLFW = GLFW_KEY_BACKSLASH;
        else if (strcmp(name, "LSGT") == 0) keyCodeGLFW = GLFW_KEY_WORLD_1;
        else keyCodeGLFW = GLFW_KEY_UNKNOWN;

        // Update the key code LUT
        if ((keyCode >= 0) && (keyCode < 256))
            _glfw.x11.keyCodeLUT[keyCode] = keyCodeGLFW;
    }

    // Free the keyboard description
    XkbFreeKeyboard(descr, 0, True);

    // Translate the un-translated key codes using traditional X11 KeySym
    // lookups
    for (keyCode = 0;  keyCode < 256;  keyCode++)
    {
        if (_glfw.x11.keyCodeLUT[keyCode] < 0)
            _glfw.x11.keyCodeLUT[keyCode] = translateKey(keyCode);
    }
}